

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnElemSegmentElemExpr_RefFunc
          (BinaryReaderInterp *this,Index segment_index,Index func_index)

{
  bool bVar1;
  value_type local_a0;
  reference local_98;
  ElemDesc *elem;
  Var local_70;
  Enum local_24;
  Index local_20;
  Index local_1c;
  Index func_index_local;
  Index segment_index_local;
  BinaryReaderInterp *this_local;
  
  local_20 = func_index;
  local_1c = segment_index;
  _func_index_local = this;
  Location::Location((Location *)&elem);
  Var::Var(&local_70,func_index,(Location *)&elem);
  local_24 = (Enum)SharedValidator::OnElemSegmentElemExpr_RefFunc
                             (&this->validator_,
                              (Location *)(anonymous_namespace)::BinaryReaderInterp::loc,&local_70);
  bVar1 = Failed((Result)local_24);
  Var::~Var(&local_70);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    local_98 = std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>::back
                         (&this->module_->elems);
    local_a0.kind = RefFunc;
    local_a0.index = local_20;
    std::vector<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>::push_back
              (&local_98->elements,&local_a0);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnElemSegmentElemExpr_RefFunc(Index segment_index,
                                                         Index func_index) {
  CHECK_RESULT(validator_.OnElemSegmentElemExpr_RefFunc(loc, Var(func_index)));
  ElemDesc& elem = module_.elems.back();
  elem.elements.push_back(ElemExpr{ElemKind::RefFunc, func_index});
  return Result::Ok;
}